

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instruction_X86.h
# Opt level: O0

void __thiscall x86Argument::x86Argument(x86Argument *this,unsigned_long_long num)

{
  unsigned_long_long num_local;
  x86Argument *this_local;
  
  this->type = argImm64;
  (this->field_1).imm64Arg = num;
  this->ptrBase = rNONE;
  this->ptrIndex = rNONE;
  this->ptrMult = 0;
  this->ptrNum = 0;
  return;
}

Assistant:

explicit x86Argument(unsigned long long num)
	{
		this->type = argImm64;
		this->imm64Arg = num;
		this->ptrBase = rNONE;
		this->ptrIndex = rNONE;
		this->ptrMult = 0;
		this->ptrNum = 0;
	}